

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableGcCompactTransientBuffers(ImGuiTable *table)

{
  ImGuiContext_conflict1 *pIVar1;
  ImPoolIdx i;
  ImGuiTableColumn *pIVar2;
  float *pfVar3;
  int n;
  int i_00;
  
  pIVar1 = GImGui;
  if (table->MemoryCompacted == false) {
    (table->SortSpecs).Specs = (ImGuiTableColumnSortSpecs *)0x0;
    ImVector<ImGuiTableColumnSortSpecs>::clear(&table->SortSpecsMulti);
    table->IsSortSpecsDirty = true;
    ImVector<char>::clear(&(table->ColumnsNames).Buf);
    table->MemoryCompacted = true;
    for (i_00 = 0; i_00 < table->ColumnsCount; i_00 = i_00 + 1) {
      pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,i_00);
      pIVar2->NameOffset = -1;
    }
    i = ImPool<ImGuiTable>::GetIndex(&pIVar1->Tables,table);
    pfVar3 = ImVector<float>::operator[](&pIVar1->TablesLastTimeActive,i);
    *pfVar3 = -1.0;
    return;
  }
  __assert_fail("table->MemoryCompacted == false",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                ,0xd8a,"void ImGui::TableGcCompactTransientBuffers(ImGuiTable *)");
}

Assistant:

void ImGui::TableGcCompactTransientBuffers(ImGuiTable* table)
{
    //IMGUI_DEBUG_LOG("TableGcCompactTransientBuffers() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->MemoryCompacted == false);
    table->SortSpecs.Specs = NULL;
    table->SortSpecsMulti.clear();
    table->IsSortSpecsDirty = true; // FIXME: shouldn't have to leak into user performing a sort
    table->ColumnsNames.clear();
    table->MemoryCompacted = true;
    for (int n = 0; n < table->ColumnsCount; n++)
        table->Columns[n].NameOffset = -1;
    g.TablesLastTimeActive[g.Tables.GetIndex(table)] = -1.0f;
}